

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

BOOL __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::IsFreeObject
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *objectAddress)

{
  byte bVar1;
  ushort uVar2;
  char *pcVar3;
  SmallHeapBlockBitVector *this_00;
  ushort index;
  void *objectAddress_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  pcVar3 = GetAddress(this);
  if ((pcVar3 <= objectAddress) && (pcVar3 = GetEndAddress(this), objectAddress < pcVar3)) {
    uVar2 = GetAddressIndex(this,objectAddress);
    if (uVar2 == 0xffff) {
      return 0;
    }
    this_00 = GetDebugFreeBitVector(this);
    uVar2 = GetAddressBitIndex(objectAddress);
    bVar1 = BVStatic<2048UL>::Test(this_00,(uint)uVar2);
    return (uint)bVar1;
  }
  return 0;
}

Assistant:

BOOL
SmallHeapBlockT<TBlockAttributes>::IsFreeObject(void * objectAddress)
{
    if (objectAddress < this->GetAddress() || objectAddress >= this->GetEndAddress())
    {
        return false;
    }
    ushort index = GetAddressIndex(objectAddress);
    if (index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)
    {
        return false;
    }

    return this->GetDebugFreeBitVector()->Test(GetAddressBitIndex(objectAddress));
}